

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O2

void __thiscall wasm::Vacuum::visitDrop(Vacuum *this,Drop *curr)

{
  LocalSet *this_00;
  ulong uVar1;
  uintptr_t uVar2;
  bool bVar3;
  Id IVar4;
  LocalSet *this_01;
  Expression **ppEVar5;
  Expression *pEVar6;
  undefined1 auStack_198 [8];
  BranchSeeker seeker;
  LocalSet *local_38;
  Expression *temp;
  
  this_01 = (LocalSet *)optimize(this,curr->value,false,false);
  curr->value = (Expression *)this_01;
  if (this_01 == (LocalSet *)0x0) goto LAB_00bfd3fd;
  IVar4 = (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id;
  if (IVar4 == LocalSetId) {
    bVar3 = LocalSet::isTee(this_01);
    if (bVar3) {
      LocalSet::makeSet(this_01);
      ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                  ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                 (Expression *)this_01);
      return;
    }
    __assert_fail("set->isTee()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Vacuum.cpp"
                  ,0x14f,"void wasm::Vacuum::visitDrop(Drop *)");
  }
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id == 0) {
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)auStack_198,
               &((this->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,
               (Expression *)curr);
    bVar3 = EffectAnalyzer::hasUnremovableSideEffects((EffectAnalyzer *)auStack_198);
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)auStack_198);
    if (!bVar3) goto LAB_00bfd3fd;
    this_01 = (LocalSet *)curr->value;
    IVar4 = (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id;
  }
  if (IVar4 == BlockId) {
    this_00 = this_01 + 1;
    ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         this_00);
    uVar1 = ((*ppEVar5)->type).id;
    if (((1 < uVar1) &&
        ((this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id ==
         uVar1)) && (pEVar6 = optimize(this,*ppEVar5,false,false), pEVar6 == (Expression *)0x0)) {
      if (this_01->value != (Expression *)0x0) {
        seeker.
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .currModule = *(Module **)&this_01->index;
        seeker._232_8_ = &seeker.types._M_h._M_rehash_policy._M_next_resize;
        auStack_198 = (undefined1  [8])0x0;
        seeker.
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .replacep = (Expression **)0x0;
        seeker.
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .stack.fixed._M_elems[9].currp = (Expression **)0x0;
        seeker.
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        seeker.
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        seeker.
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        seeker.
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .currFunction = (Function *)0x0;
        seeker.target.super_IString.str._M_str._0_4_ = 0;
        seeker.types._M_h._M_buckets = (__buckets_ptr)0x1;
        seeker.types._M_h._M_bucket_count = 0;
        seeker.types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        seeker.types._M_h._M_element_count._0_4_ = 0x3f800000;
        seeker.types._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        seeker.types._M_h._M_rehash_policy._4_4_ = 0;
        seeker.types._M_h._M_rehash_policy._M_next_resize = 0;
        seeker.target.super_IString.str._M_len = (size_t)this_01->value;
        local_38 = this_01;
        Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        ::walk((Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                *)auStack_198,(Expression **)&local_38);
        if ((int)seeker.target.super_IString.str._M_str == 0) {
          BranchUtils::BranchSeeker::~BranchSeeker((BranchSeeker *)auStack_198);
        }
        else {
          bVar3 = wasm::Type::
                  hasLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                            ((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                              *)&seeker.found);
          BranchUtils::BranchSeeker::~BranchSeeker((BranchSeeker *)auStack_198);
          if (bVar3) goto LAB_00bfd290;
        }
      }
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           this_00);
      *ppEVar5 = (Expression *)0x0;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
      uVar1 = this_01[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression.type.id;
      if (uVar1 < 2) {
        if (uVar1 != 1) {
LAB_00bfd3fd:
          (curr->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = NopId;
          (curr->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
          return;
        }
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )this_00,0);
        this_01 = (LocalSet *)*ppEVar5;
      }
      goto LAB_00bfd304;
    }
  }
LAB_00bfd290:
  this_01 = (LocalSet *)curr->value;
  if ((this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id != IfId) {
    return;
  }
  pEVar6 = *(Expression **)
            &this_01[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression;
  if (pEVar6 == (Expression *)0x0) {
    return;
  }
  if ((this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id < 2) {
    return;
  }
  uVar2 = (this_01->value->type).id;
  uVar1 = (pEVar6->type).id;
  if (uVar2 == 1) {
    if (uVar1 < 2) {
      return;
    }
    curr->value = pEVar6;
    *(Drop **)&this_01[1].super_SpecificExpression<(wasm::Expression::Id)9>.super_Expression = curr;
  }
  else {
    if (uVar2 == 0 || uVar1 != 1) {
      return;
    }
    curr->value = this_01->value;
    this_01->value = (Expression *)curr;
  }
  (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
LAB_00bfd304:
  ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
              ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
             (Expression *)this_01);
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    // optimize the dropped value, maybe leaving nothing
    curr->value = optimize(curr->value, false, false);
    if (curr->value == nullptr) {
      ExpressionManipulator::nop(curr);
      return;
    }
    // a drop of a tee is a set
    if (auto* set = curr->value->dynCast<LocalSet>()) {
      assert(set->isTee());
      set->makeSet();
      replaceCurrent(set);
      return;
    }

    // If the value has no side effects, or it has side effects we can remove,
    // do so. This basically means that if noTrapsHappen is set then we can
    // use that assumption (that no trap actually happens at runtime) and remove
    // a trapping value.
    //
    // TODO: A complete CFG analysis for noTrapsHappen mode, removing all code
    //       that definitely reaches a trap, *even if* it has side effects.
    //
    // Note that we check the type here to avoid removing unreachable code - we
    // leave that for DCE.
    if (curr->type == Type::none &&
        !EffectAnalyzer(getPassOptions(), *getModule(), curr)
           .hasUnremovableSideEffects()) {
      ExpressionManipulator::nop(curr);
      return;
    }

    // if we are dropping a block's return value, we might be able to remove it
    // entirely
    if (auto* block = curr->value->dynCast<Block>()) {
      auto* last = block->list.back();
      // note that the last element may be concrete but not the block, if the
      // block has an unreachable element in the middle, making the block
      // unreachable despite later elements and in particular the last
      if (last->type.isConcrete() && block->type == last->type) {
        last = optimize(last, false, false);
        if (!last) {
          // we may be able to remove this, if there are no brs
          bool canPop = true;
          if (block->name.is()) {
            BranchUtils::BranchSeeker seeker(block->name);
            Expression* temp = block;
            seeker.walk(temp);
            if (seeker.found && Type::hasLeastUpperBound(seeker.types)) {
              canPop = false;
            }
          }
          if (canPop) {
            block->list.back() = last;
            block->list.pop_back();
            block->type = Type::none;
            // we don't need the drop anymore, let's see what we have left in
            // the block
            if (block->list.size() > 1) {
              replaceCurrent(block);
            } else if (block->list.size() == 1) {
              replaceCurrent(block->list[0]);
            } else {
              ExpressionManipulator::nop(curr);
            }
            return;
          }
        }
      }
    }
    // sink a drop into an arm of an if-else if the other arm ends in an
    // unreachable, as it if is a branch, this can make that branch optimizable
    // and more vaccuming possible
    auto* iff = curr->value->dynCast<If>();
    if (iff && iff->ifFalse && iff->type.isConcrete()) {
      // reuse the drop in both cases
      if (iff->ifTrue->type == Type::unreachable &&
          iff->ifFalse->type.isConcrete()) {
        curr->value = iff->ifFalse;
        iff->ifFalse = curr;
        iff->type = Type::none;
        replaceCurrent(iff);
      } else if (iff->ifFalse->type == Type::unreachable &&
                 iff->ifTrue->type.isConcrete()) {
        curr->value = iff->ifTrue;
        iff->ifTrue = curr;
        iff->type = Type::none;
        replaceCurrent(iff);
      }
    }
  }